

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_label.cc
# Opt level: O1

void no_label::output_and_account_no_label_example(vw *all,example *ec)

{
  float fVar1;
  float fVar2;
  size_t sVar3;
  shared_data *psVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  int *piVar8;
  ulong uVar9;
  
  psVar4 = all->sd;
  fVar1 = ec->weight;
  fVar2 = ec->loss;
  sVar3 = ec->num_features;
  psVar4->t = psVar4->t + (double)fVar1;
  psVar4->weighted_unlabeled_examples = (double)fVar1 + psVar4->weighted_unlabeled_examples;
  dVar6 = (double)fVar2 + psVar4->sum_loss;
  dVar7 = (double)fVar2 + psVar4->sum_loss_since_last_dump;
  auVar5._8_4_ = SUB84(dVar7,0);
  auVar5._0_8_ = dVar6;
  auVar5._12_4_ = (int)((ulong)dVar7 >> 0x20);
  psVar4->sum_loss = dVar6;
  psVar4->sum_loss_since_last_dump = (double)auVar5._8_8_;
  psVar4->example_number = psVar4->example_number + 1;
  psVar4->total_features = sVar3 + psVar4->total_features;
  (*all->print)(all->raw_prediction,ec->partial_prediction,-1.0,ec->tag);
  piVar8 = (all->final_prediction_sink)._begin;
  if ((all->final_prediction_sink)._end != piVar8) {
    uVar9 = 0;
    do {
      (*all->print)(piVar8[uVar9],(ec->pred).scalar,0.0,ec->tag);
      uVar9 = uVar9 + 1;
      piVar8 = (all->final_prediction_sink)._begin;
    } while (uVar9 < (ulong)((long)(all->final_prediction_sink)._end - (long)piVar8 >> 2));
  }
  print_no_label_update(all,ec);
  return;
}

Assistant:

void output_and_account_no_label_example(vw& all, example& ec)
{
  all.sd->update(ec.test_only, false, ec.loss, ec.weight, ec.num_features);

  all.print(all.raw_prediction, ec.partial_prediction, -1, ec.tag);
  for (size_t i = 0; i < all.final_prediction_sink.size(); i++)
  {
    int f = (int)all.final_prediction_sink[i];
    all.print(f, ec.pred.scalar, 0, ec.tag);
  }

  print_no_label_update(all, ec);
}